

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_binning_array_unaligned.h
# Opt level: O1

Split * __thiscall
embree::sse2::UnalignedHeuristicArrayBinningSAH<embree::PrimRef,_32UL>::find_template<true>
          (Split *__return_storage_ptr__,
          UnalignedHeuristicArrayBinningSAH<embree::PrimRef,_32UL> *this,PrimInfoRange *set,
          size_t logBlockSize,LinearSpace3fa *space)

{
  int *piVar1;
  char *pcVar2;
  undefined8 *puVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  undefined8 uVar6;
  char cVar7;
  unsigned_long __i0;
  long lVar8;
  ulong uVar9;
  undefined1 (*pauVar10) [16];
  runtime_error *this_00;
  undefined8 *puVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *__return_storage_ptr___00;
  BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *identity;
  float fVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  uint uVar30;
  uint uVar31;
  float fVar32;
  uint uVar33;
  uint uVar34;
  float fVar35;
  float fVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  undefined1 auVar45 [16];
  float fVar47;
  undefined1 auVar46 [16];
  undefined1 auVar48 [16];
  float fVar49;
  float fVar50;
  undefined1 auVar51 [16];
  vuint4 vbestPos;
  BinMapping<32UL> mapping;
  BinBoundsAndCenter binBoundsAndCenter;
  task_group_context context;
  Binner binner;
  vfloat4 rAreas [32];
  anon_class_24_3_4f408fa6 local_1f70;
  blocked_range<unsigned_long> local_1f50;
  ulong local_1f30;
  anon_class_8_1_b5464bae local_1f10;
  PrimRef *local_1f08;
  undefined1 local_1f00 [20];
  float fStack_1eec;
  float fStack_1ee8;
  float fStack_1ee4;
  float local_1ee0;
  uint uStack_1edc;
  uint uStack_1ed8;
  uint uStack_1ed4;
  anon_class_16_2_ed117de8_conflict14 local_1ed0;
  BinBoundsAndCenter local_1ec0;
  task_group_context local_1e80 [3];
  undefined1 auStack_1c90 [16];
  undefined1 local_1c80 [3580];
  undefined4 uStack_e84;
  undefined1 local_e80 [20];
  float afStack_e6c [763];
  undefined1 local_280 [592];
  
  lVar8 = 0xc00;
  puVar11 = (undefined8 *)(local_1c80 + 0x50);
  do {
    puVar11[-2] = 0x7f8000007f800000;
    puVar11[-1] = 0x7f8000007f800000;
    *puVar11 = 0xff800000ff800000;
    puVar11[1] = 0xff800000ff800000;
    puVar11[-6] = 0x7f8000007f800000;
    puVar11[-5] = 0x7f8000007f800000;
    puVar11[-4] = 0xff800000ff800000;
    puVar11[-3] = 0xff800000ff800000;
    puVar11[-10] = 0x7f8000007f800000;
    puVar11[-9] = 0x7f8000007f800000;
    puVar11[-8] = 0xff800000ff800000;
    puVar11[-7] = 0xff800000ff800000;
    *(undefined8 *)(local_1c80 + lVar8) = 0;
    *(undefined8 *)(local_1c80 + lVar8 + 8) = 0;
    lVar8 = lVar8 + 0x10;
    puVar11 = puVar11 + 0xc;
  } while (lVar8 != 0xe00);
  uVar4 = (set->super_range<unsigned_long>)._begin;
  uVar5 = (set->super_range<unsigned_long>)._end;
  fVar17 = (float)(uVar5 - uVar4) * 0.05 + 4.0;
  uVar9 = (ulong)fVar17;
  uVar9 = (long)(fVar17 - 9.223372e+18) & (long)uVar9 >> 0x3f | uVar9;
  local_1f00._0_8_ = 0x20;
  if (uVar9 < 0x20) {
    local_1f00._0_8_ = uVar9;
  }
  local_1f70.mapping = (BinMapping<32UL> *)local_1f00;
  local_1f00._16_4_ = (set->super_CentGeomBBox3fa).centBounds.lower.field_0.m128[0];
  fStack_1eec = (set->super_CentGeomBBox3fa).centBounds.lower.field_0.m128[1];
  fStack_1ee8 = (set->super_CentGeomBBox3fa).centBounds.lower.field_0.m128[2];
  fStack_1ee4 = (set->super_CentGeomBBox3fa).centBounds.lower.field_0.m128[3];
  auVar26._0_4_ =
       (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[0] - (float)local_1f00._16_4_;
  auVar26._4_4_ = (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[1] - fStack_1eec;
  auVar26._8_4_ = (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[2] - fStack_1ee8;
  auVar26._12_4_ = (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[3] - fStack_1ee4;
  auVar26 = maxps(_DAT_01fecb10,auVar26);
  auVar28._0_4_ = (float)(long)local_1f00._0_8_ * 0.99;
  auVar28._4_4_ = auVar28._0_4_;
  auVar28._8_4_ = auVar28._0_4_;
  auVar28._12_4_ = auVar28._0_4_;
  auVar28 = divps(auVar28,auVar26);
  local_1ee0 = (float)(-(uint)((float)DAT_01fecb10 < auVar26._0_4_) & auVar28._0_4_);
  uStack_1edc = -(uint)(DAT_01fecb10._4_4_ < auVar26._4_4_) & auVar28._4_4_;
  uStack_1ed8 = -(uint)(DAT_01fecb10._8_4_ < auVar26._8_4_) & auVar28._8_4_;
  uStack_1ed4 = -(uint)(DAT_01fecb10._12_4_ < auVar26._12_4_) & auVar28._12_4_;
  local_1ec0.scene = this->scene;
  local_1f70.binBoundsAndCenter = &local_1ec0;
  local_1ec0.space.vx.field_0._0_8_ = *(undefined8 *)&(space->vx).field_0;
  local_1ec0.space.vx.field_0._8_8_ = *(undefined8 *)((long)&(space->vx).field_0 + 8);
  local_1ec0.space.vy.field_0._0_8_ = *(undefined8 *)&(space->vy).field_0;
  local_1ec0.space.vy.field_0._8_8_ = *(undefined8 *)((long)&(space->vy).field_0 + 8);
  local_1ec0.space.vz.field_0._0_8_ = *(undefined8 *)&(space->vz).field_0;
  local_1ec0.space.vz.field_0._8_8_ = *(undefined8 *)((long)&(space->vz).field_0 + 8);
  local_1f08 = this->prims;
  local_1f70.prims = &local_1f08;
  local_1e80[0].my_version = proxy_support;
  local_1e80[0].my_traits = (context_traits)0x4;
  local_1e80[0].my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_1e80[0].my_node.my_next_node = (intrusive_list_node *)0x0;
  local_1e80[0].my_name = CUSTOM_CTX;
  local_1f10.mapping = local_1f70.mapping;
  tbb::detail::r1::initialize(local_1e80);
  local_1f50.my_begin = uVar4;
  local_1f50.my_end = uVar5;
  local_1f50.my_grainsize = 0x1000;
  __return_storage_ptr___00 =
       (BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *)local_e80;
  identity = (BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *)local_1c80;
  local_1ed0.reduction = &local_1f10;
  local_1ed0.func = &local_1f70;
  tbb::detail::d1::
  parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,_embree::sse2::BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders____builders_______common_algorithms_parallel_reduce_h:59:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders____builders_heuristic_binning_h:549:31)>
            (__return_storage_ptr___00,&local_1f50,identity,&local_1ed0,&local_1f10,local_1e80);
  cVar7 = tbb::detail::r1::is_group_execution_cancelled(local_1e80);
  if (cVar7 == '\0') {
    tbb::detail::r1::destroy(local_1e80);
    lVar8 = 0;
    do {
      lVar12 = 0x10;
      do {
        puVar11 = (undefined8 *)((long)(__return_storage_ptr___00->_bounds + -1) + 0x50 + lVar12);
        uVar6 = puVar11[1];
        puVar3 = (undefined8 *)((long)(identity->_bounds + -1) + 0x50 + lVar12);
        *puVar3 = *puVar11;
        puVar3[1] = uVar6;
        puVar11 = (undefined8 *)
                  ((long)&__return_storage_ptr___00->_bounds[0][0].lower.field_0 + lVar12);
        uVar6 = puVar11[1];
        puVar3 = (undefined8 *)((long)&identity->_bounds[0][0].lower.field_0 + lVar12);
        *puVar3 = *puVar11;
        puVar3[1] = uVar6;
        lVar12 = lVar12 + 0x20;
      } while (lVar12 != 0x70);
      lVar8 = lVar8 + 1;
      __return_storage_ptr___00 =
           (BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *)
           (__return_storage_ptr___00->_bounds + 1);
      identity = (BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *)
                 (identity->_bounds + 1);
    } while (lVar8 != 0x20);
    memcpy(local_1c80 + 0xc00,local_280,0x200);
    lVar8 = local_1f00._0_8_ - 1;
    if (lVar8 != 0) {
      lVar15 = local_1f00._0_8_ * 0x10;
      pauVar10 = (undefined1 (*) [16])(auStack_1c90 + local_1f00._0_8_ * 0x60);
      iVar18 = 0;
      iVar19 = 0;
      iVar20 = 0;
      iVar21 = 0;
      lVar16 = 0;
      lVar12 = lVar8;
      auVar26 = _DAT_01feba00;
      auVar28 = _DAT_01feb9f0;
      auVar27 = _DAT_01feba00;
      auVar29 = _DAT_01feb9f0;
      auVar45 = _DAT_01feb9f0;
      auVar46 = _DAT_01feba00;
      do {
        piVar1 = (int *)(local_1c80 + lVar16 + lVar15 + 0xbf0);
        iVar18 = iVar18 + *piVar1;
        iVar19 = iVar19 + piVar1[1];
        iVar20 = iVar20 + piVar1[2];
        iVar21 = iVar21 + piVar1[3];
        pcVar2 = local_1e80[0].padding + lVar16 + lVar15 + -0x58;
        *(int *)pcVar2 = iVar18;
        *(int *)(pcVar2 + 4) = iVar19;
        *(int *)(pcVar2 + 8) = iVar20;
        *(int *)(pcVar2 + 0xc) = iVar21;
        auVar45 = minps(auVar45,pauVar10[-5]);
        auVar46 = maxps(auVar46,pauVar10[-4]);
        fVar17 = auVar46._4_4_ - auVar45._4_4_;
        fVar32 = auVar46._8_4_ - auVar45._8_4_;
        auVar28 = minps(auVar28,pauVar10[-3]);
        auVar26 = maxps(auVar26,pauVar10[-2]);
        fVar35 = auVar26._4_4_ - auVar28._4_4_;
        fVar36 = auVar26._8_4_ - auVar28._8_4_;
        *(ulong *)(local_1c80 + lVar16 + lVar15 + 0xdf0) =
             CONCAT44((auVar26._0_4_ - auVar28._0_4_) * (fVar35 + fVar36) + fVar36 * fVar35,
                      (auVar46._0_4_ - auVar45._0_4_) * (fVar17 + fVar32) + fVar32 * fVar17);
        auVar29 = minps(auVar29,pauVar10[-1]);
        auVar27 = maxps(auVar27,*pauVar10);
        fVar17 = auVar27._4_4_ - auVar29._4_4_;
        fVar32 = auVar27._8_4_ - auVar29._8_4_;
        *(float *)(local_1c80 + lVar16 + lVar15 + 0xdf8) =
             (fVar17 + fVar32) * (auVar27._0_4_ - auVar29._0_4_) + fVar32 * fVar17;
        *(undefined4 *)((long)&uStack_e84 + lVar16 + lVar15) = 0;
        lVar16 = lVar16 + -0x10;
        pauVar10 = pauVar10 + -6;
        lVar12 = lVar12 + -1;
      } while (lVar12 != 0);
    }
    uVar9 = 0xffffffff;
    local_1f50.my_end = _DAT_01feb9f0;
    local_1f50.my_begin = _UNK_01feb9f8;
    uVar37 = 0;
    uVar38 = 0;
    uVar39 = 0;
    uVar40 = 0;
    local_1f70.prims = (PrimRef **)0x0;
    local_1f70.mapping = (BinMapping<32UL> *)0x0;
    auVar26 = _DAT_01feb9f0;
    if (1 < (ulong)local_1f00._0_8_) {
      uVar14 = ~(-1 << ((byte)logBlockSize & 0x1f));
      uVar22 = 1;
      uVar23 = 1;
      uVar24 = 1;
      uVar25 = 1;
      iVar18 = 0;
      iVar19 = 0;
      iVar20 = 0;
      iVar21 = 0;
      pauVar10 = (undefined1 (*) [16])(local_1c80 + 0x50);
      lVar12 = 0;
      uVar37 = 0;
      uVar38 = 0;
      uVar39 = 0;
      uVar40 = 0;
      auVar28 = _DAT_01feba00;
      auVar27 = _DAT_01feb9f0;
      auVar29 = _DAT_01feba00;
      auVar45 = _DAT_01feba00;
      auVar46 = _DAT_01feb9f0;
      auVar48 = _DAT_01feb9f0;
      do {
        auVar27 = minps(auVar27,pauVar10[-5]);
        auVar28 = maxps(auVar28,pauVar10[-4]);
        auVar46 = minps(auVar46,pauVar10[-3]);
        auVar45 = maxps(auVar45,pauVar10[-2]);
        fVar49 = auVar28._4_4_ - auVar27._4_4_;
        fVar50 = auVar28._8_4_ - auVar27._8_4_;
        auVar48 = minps(auVar48,pauVar10[-1]);
        fVar17 = auVar45._4_4_ - auVar46._4_4_;
        fVar32 = auVar45._8_4_ - auVar46._8_4_;
        auVar29 = maxps(auVar29,*pauVar10);
        fVar35 = auVar29._0_4_ - auVar48._0_4_;
        fVar36 = auVar29._4_4_ - auVar48._4_4_;
        fVar47 = auVar29._8_4_ - auVar48._8_4_;
        iVar18 = iVar18 + *(int *)(local_1c80 + lVar12 + 0xc00);
        iVar19 = iVar19 + *(int *)(local_1c80 + lVar12 + 0xc04);
        iVar20 = iVar20 + *(int *)(local_1c80 + lVar12 + 0xc08);
        iVar21 = iVar21 + *(int *)(local_1c80 + lVar12 + 0xc0c);
        local_1f30 = logBlockSize & 0xffffffff;
        uVar30 = iVar18 + uVar14 >> local_1f30;
        uVar31 = iVar19 + uVar14 >> local_1f30;
        uVar33 = iVar20 + uVar14 >> local_1f30;
        uVar34 = iVar21 + uVar14 >> local_1f30;
        uVar41 = *(int *)(local_1e80[0].padding + lVar12 + -0x38) + uVar14 >> local_1f30;
        uVar42 = *(int *)(local_1e80[0].padding + lVar12 + -0x34) + uVar14 >> local_1f30;
        uVar43 = *(int *)(local_1e80[0].padding + lVar12 + -0x30) + uVar14 >> local_1f30;
        uVar44 = *(int *)(local_1e80[0].padding + lVar12 + -0x2c) + uVar14 >> local_1f30;
        auVar51._0_4_ =
             ((float)(uVar41 & 0x7fffffff) + (float)((int)uVar41 >> 0x1f & 0x4f000000)) *
             *(float *)(local_e80 + lVar12 + 0x10) +
             ((float)(uVar30 & 0x7fffffff) + (float)((int)uVar30 >> 0x1f & 0x4f000000)) *
             ((auVar28._0_4_ - auVar27._0_4_) * (fVar49 + fVar50) + fVar50 * fVar49);
        auVar51._4_4_ =
             ((float)(uVar42 & 0x7fffffff) + (float)((int)uVar42 >> 0x1f & 0x4f000000)) *
             *(float *)((long)afStack_e6c + lVar12) +
             ((float)(uVar31 & 0x7fffffff) + (float)((int)uVar31 >> 0x1f & 0x4f000000)) *
             ((auVar45._0_4_ - auVar46._0_4_) * (fVar17 + fVar32) + fVar32 * fVar17);
        auVar51._8_4_ =
             ((float)(uVar43 & 0x7fffffff) + (float)((int)uVar43 >> 0x1f & 0x4f000000)) *
             *(float *)((long)afStack_e6c + lVar12 + 4) +
             ((float)(uVar33 & 0x7fffffff) + (float)((int)uVar33 >> 0x1f & 0x4f000000)) *
             (fVar35 * (fVar47 + fVar36) + fVar36 * fVar47);
        auVar51._12_4_ =
             ((float)(uVar44 & 0x7fffffff) + (float)((int)uVar44 >> 0x1f & 0x4f000000)) *
             *(float *)((long)afStack_e6c + lVar12 + 8) +
             ((float)(uVar34 & 0x7fffffff) + (float)((int)uVar34 >> 0x1f & 0x4f000000)) *
             (fVar35 * (fVar36 + fVar47) + fVar47 * fVar36);
        uVar30 = -(uint)(auVar26._0_4_ <= auVar51._0_4_);
        uVar31 = -(uint)(auVar26._4_4_ <= auVar51._4_4_);
        uVar33 = -(uint)(auVar26._8_4_ <= auVar51._8_4_);
        uVar34 = -(uint)(auVar26._12_4_ <= auVar51._12_4_);
        uVar37 = ~uVar30 & uVar22 | uVar37 & uVar30;
        uVar38 = ~uVar31 & uVar23 | uVar38 & uVar31;
        uVar39 = ~uVar33 & uVar24 | uVar39 & uVar33;
        uVar40 = ~uVar34 & uVar25 | uVar40 & uVar34;
        auVar26 = minps(auVar51,auVar26);
        uVar22 = uVar22 + 1;
        uVar23 = uVar23 + 1;
        uVar24 = uVar24 + 1;
        uVar25 = uVar25 + 1;
        pauVar10 = pauVar10 + 6;
        lVar12 = lVar12 + 0x10;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
    local_1f50.my_end = auVar26._0_8_;
    local_1f50.my_begin = auVar26._8_8_;
    local_1f70.prims = (PrimRef **)CONCAT44(uVar38,uVar37);
    local_1f70.mapping = (BinMapping<32UL> *)CONCAT44(uVar40,uVar39);
    fVar17 = INFINITY;
    uVar13 = 0;
    iVar18 = 0;
    do {
      if (((((&local_1ee0)[uVar13] != 0.0) || (NAN((&local_1ee0)[uVar13]))) &&
          (fVar32 = *(float *)((long)&local_1f50.my_end + uVar13 * 4), fVar32 < fVar17)) &&
         (iVar19 = *(int *)((long)&local_1f70.prims + uVar13 * 4), iVar19 != 0)) {
        uVar9 = uVar13 & 0xffffffff;
        iVar18 = iVar19;
        fVar17 = fVar32;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != 3);
    __return_storage_ptr__->sah = fVar17;
    __return_storage_ptr__->dim = (int)uVar9;
    (__return_storage_ptr__->field_2).pos = iVar18;
    __return_storage_ptr__->data = 0;
    (__return_storage_ptr__->mapping).num = local_1f00._0_8_;
    *(ulong *)&(__return_storage_ptr__->mapping).ofs.field_0 =
         CONCAT44(fStack_1eec,local_1f00._16_4_);
    *(ulong *)((long)&(__return_storage_ptr__->mapping).ofs.field_0 + 8) =
         CONCAT44(fStack_1ee4,fStack_1ee8);
    *(ulong *)&(__return_storage_ptr__->mapping).scale.field_0 = CONCAT44(uStack_1edc,local_1ee0);
    *(ulong *)((long)&(__return_storage_ptr__->mapping).scale.field_0 + 8) =
         CONCAT44(uStack_1ed4,uStack_1ed8);
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"task cancelled");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const Split find_template(const PrimInfoRange& set, const size_t logBlockSize, const LinearSpace3fa& space)
        {
          Binner binner(empty);
          const BinMapping<BINS> mapping(set);
          BinBoundsAndCenter binBoundsAndCenter(scene,space);
          bin_serial_or_parallel<parallel>(binner,prims,set.begin(),set.end(),size_t(4096),mapping,binBoundsAndCenter);
          return binner.best(mapping,logBlockSize);
        }